

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestPartResult
          (PrettyUnitTestResultPrinter *this,TestPartResult *result)

{
  Message *pMVar1;
  int in_ECX;
  internal *this_00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  pointer local_68;
  char *local_60;
  string local_58;
  string local_38;
  
  if (result->type_ != kSuccess) {
    Message::Message((Message *)&local_70);
    this_00 = (internal *)(result->file_name_)._M_string_length;
    if (this_00 != (internal *)0x0) {
      this_00 = (internal *)(result->file_name_)._M_dataplus._M_p;
    }
    FormatFileLocation_abi_cxx11_
              (&local_58,this_00,(char *)(ulong)(uint)result->line_number_,in_ECX);
    std::operator<<((ostream *)(local_70.ptr_ + 0x10),(string *)&local_58);
    std::operator<<((ostream *)(local_70.ptr_ + 0x10)," ");
    if ((ulong)result->type_ < 3) {
      local_60 = &DAT_0013ed6c + *(int *)(&DAT_0013ed6c + (ulong)result->type_ * 4);
    }
    else {
      local_60 = "Unknown result type";
    }
    pMVar1 = Message::operator<<((Message *)&local_70,&local_60);
    local_68 = (result->message_)._M_dataplus._M_p;
    pMVar1 = Message::operator<<(pMVar1,&local_68);
    Message::GetString_abi_cxx11_(&local_38,pMVar1);
    std::__cxx11::string::_M_dispose();
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_70);
    puts(local_38._M_dataplus._M_p);
    fflush(_stdout);
    std::__cxx11::string::_M_dispose();
    fflush(_stdout);
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestPartResult(
    const TestPartResult& result) {
  // If the test part succeeded, we don't need to do anything.
  if (result.type() == TestPartResult::kSuccess)
    return;

  // Print failure message from the assertion (e.g. expected this and got that).
  PrintTestPartResult(result);
  fflush(stdout);
}